

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDefinition.cpp
# Opt level: O0

void __thiscall
Rml::ElementDefinition::ElementDefinition
          (ElementDefinition *this,Vector<const_StyleSheetNode_*> *style_sheet_nodes)

{
  bool bVar1;
  PropertyMap *pPVar2;
  const_reference ppSVar3;
  PropertyDictionary *other;
  reference ppVar4;
  const_iterator cVar5;
  pair<Rml::PropertyId,_Rml::Property> *property;
  const_iterator __end1;
  const_iterator __begin1;
  PropertyMap *__range1;
  size_t i;
  Vector<const_StyleSheetNode_*> *style_sheet_nodes_local;
  ElementDefinition *this_local;
  
  NonCopyMoveable::NonCopyMoveable((NonCopyMoveable *)this);
  PropertyDictionary::PropertyDictionary(&this->properties);
  PropertyIdSet::PropertyIdSet(&this->property_ids);
  __range1 = (PropertyMap *)0x0;
  while( true ) {
    pPVar2 = (PropertyMap *)
             ::std::
             vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::size
                       (style_sheet_nodes);
    if (pPVar2 <= __range1) break;
    ppSVar3 = ::std::
              vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>::
              operator[](style_sheet_nodes,(size_type)__range1);
    other = StyleSheetNode::GetProperties(*ppSVar3);
    PropertyDictionary::Merge(&this->properties,other,0);
    __range1 = (PropertyMap *)((long)&__range1->mKeyVals + 1);
  }
  pPVar2 = PropertyDictionary::GetProperties(&this->properties);
  cVar5 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::begin(pPVar2);
  __end1.mInfo = (uint8_t *)cVar5.mKeyVals;
  cVar5 = robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::end(pPVar2);
  while( true ) {
    __end1.mKeyVals = (NodePtr)cVar5.mInfo;
    property = &(cVar5.mKeyVals)->mData;
    bVar1 = robin_hood::detail::
            Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
            ::Iter<true>::operator!=((Iter<true> *)&__end1.mInfo,(Iter<true> *)&property);
    if (!bVar1) break;
    ppVar4 = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::Iter<true>::operator*((Iter<true> *)&__end1.mInfo);
    PropertyIdSet::Insert(&this->property_ids,ppVar4->first);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++((Iter<true> *)&__end1.mInfo);
    cVar5.mInfo = (uint8_t *)__end1.mKeyVals;
    cVar5.mKeyVals = (NodePtr)property;
  }
  return;
}

Assistant:

ElementDefinition::ElementDefinition(const Vector<const StyleSheetNode*>& style_sheet_nodes)
{
	// Initialises the element definition from the list of style sheet nodes.
	for (size_t i = 0; i < style_sheet_nodes.size(); ++i)
		properties.Merge(style_sheet_nodes[i]->GetProperties());

	for (auto& property : properties.GetProperties())
		property_ids.Insert(property.first);
}